

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerMSL::declare_undefined_values(CompilerMSL *this)

{
  uint uVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  Variant *pVVar4;
  SPIRUndef *pSVar5;
  SPIRType *pSVar6;
  undefined1 *extraout_RAX;
  undefined1 *puVar7;
  long lVar8;
  LoopLock local_c0;
  ulong local_b8;
  string local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  ParsedIR::create_loop_hard_lock(&(this->super_CompilerGLSL).super_Compiler.ir);
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[0xc].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 == 0) {
    ParsedIR::LoopLock::~LoopLock(&local_c0);
  }
  else {
    pTVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[0xc].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar8 = 0;
    local_b8 = 0;
    do {
      uVar1 = *(uint *)((long)&pTVar3->id + lVar8);
      pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar1].type == TypeUndef) {
        pSVar5 = Variant::get<spirv_cross::SPIRUndef>(pVVar4 + uVar1);
        pSVar6 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)&(pSVar5->super_IVariant).field_0xc);
        if (*(int *)&(pSVar6->super_IVariant).field_0xc != 1) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (local_90,this,(ulong)(pSVar5->super_IVariant).self.id,1);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                    (&local_70,this,pSVar6,local_90,(ulong)(pSVar5->super_IVariant).self.id);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          local_b0.field_2._M_allocated_capacity = 0x746e6174736e6f63;
          local_b0._M_string_length = 8;
          local_b0.field_2._M_local_buf[8] = '\0';
          inject_top_level_storage_qualifier(&local_50,&local_70,&local_b0);
          CompilerGLSL::statement<std::__cxx11::string,char_const(&)[7]>
                    (&this->super_CompilerGLSL,&local_50,(char (*) [7])" = {};");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          puVar7 = local_80;
          if (local_90[0] != puVar7) {
            operator_delete(local_90[0]);
            puVar7 = extraout_RAX;
          }
          local_b8 = CONCAT71((int7)((ulong)puVar7 >> 8),1);
        }
      }
      lVar8 = lVar8 + 4;
    } while (sVar2 << 2 != lVar8);
    ParsedIR::LoopLock::~LoopLock(&local_c0);
    if ((local_b8 & 1) != 0) {
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x33ead6);
    }
  }
  return;
}

Assistant:

void CompilerMSL::declare_undefined_values()
{
	bool emitted = false;
	ir.for_each_typed_id<SPIRUndef>([&](uint32_t, SPIRUndef &undef) {
		auto &type = this->get<SPIRType>(undef.basetype);
		// OpUndef can be void for some reason ...
		if (type.basetype == SPIRType::Void)
			return;

		statement(inject_top_level_storage_qualifier(
				variable_decl(type, to_name(undef.self), undef.self),
				"constant"),
		          " = {};");
		emitted = true;
	});

	if (emitted)
		statement("");
}